

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O0

void __thiscall CmdOpts::usage(CmdOpts *this,FILE *out)

{
  char *pcVar1;
  char *end;
  char *start;
  char name [40];
  int optIdx;
  FILE *out_local;
  CmdOpts *this_local;
  
  name[0x24] = '\0';
  name[0x25] = '\0';
  name[0x26] = '\0';
  name[0x27] = '\0';
  for (; (int)name._36_4_ < this->_numOpts; name._36_4_ = name._36_4_ + 1) {
    if (this->_opts[(int)name._36_4_].arg.has == ArgOptional) {
      snprintf((char *)&start,0x28,"  -%c, --%s[=%s]",
               (ulong)(uint)(int)this->_opts[(int)name._36_4_].letter,
               this->_opts[(int)name._36_4_].name,this->_opts[(int)name._36_4_].arg.name);
    }
    else if (this->_opts[(int)name._36_4_].arg.has == ArgRequired) {
      snprintf((char *)&start,0x28,"  -%c, --%s=%s",
               (ulong)(uint)(int)this->_opts[(int)name._36_4_].letter,
               this->_opts[(int)name._36_4_].name,this->_opts[(int)name._36_4_].arg.name);
    }
    else {
      snprintf((char *)&start,0x28,"  -%c, --%s",
               (ulong)(uint)(int)this->_opts[(int)name._36_4_].letter,
               this->_opts[(int)name._36_4_].name);
    }
    fprintf((FILE *)out,"%-23s ",&start);
    end = this->_opts[(int)name._36_4_].help;
    while (pcVar1 = strchr(end,10), pcVar1 != (char *)0x0) {
      fwrite(end,(size_t)(pcVar1 + (1 - (long)end)),1,(FILE *)out);
      fprintf((FILE *)out,"%24s","");
      end = pcVar1 + 1;
    }
    fprintf((FILE *)out,"%s\n",end);
  }
  return;
}

Assistant:

void
CmdOpts::usage(FILE* out)
{
    int optIdx;
    char name[40];
    const char* start;
    const char* end;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
    {
        if (_opts[optIdx].arg.has == ArgOptional)
            snprintf(name, sizeof(name), "  -%c, --%s[=%s]",
                    _opts[optIdx].letter,
                    _opts[optIdx].name,
                    _opts[optIdx].arg.name);
        else if (_opts[optIdx].arg.has == ArgRequired)
            snprintf(name, sizeof(name), "  -%c, --%s=%s",
                     _opts[optIdx].letter,
                     _opts[optIdx].name,
                     _opts[optIdx].arg.name);
        else
            snprintf(name, sizeof(name), "  -%c, --%s",
                     _opts[optIdx].letter,
                     _opts[optIdx].name);

        fprintf(out, "%-23s ", name);

        start = _opts[optIdx].help;
        while ((end = strchr(start, '\n')))
        {
            fwrite(start, end - start + 1, 1, out);
            fprintf(out, "%24s", "");
            start = end + 1;
        }
        fprintf(out, "%s\n", start);
    }
}